

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AS_02_ACES.cpp
# Opt level: O0

Rational AS_02::ConvertToRational(double in)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  i32_t t;
  i32_t ai;
  i32_t maxden;
  double startx;
  double x;
  i32_t m [2] [2];
  double in_local;
  
  iVar1 = std::numeric_limits<int>::max();
  m[0][1] = 1;
  x._0_4_ = 1;
  m[0][0] = 0;
  x._4_4_ = 0;
  startx = in;
  while (iVar4 = (int)(long)startx, m[0][0] * iVar4 + m[0][1] <= iVar1) {
    iVar2 = x._0_4_ * iVar4 + x._4_4_;
    x._4_4_ = x._0_4_;
    iVar3 = m[0][0] * iVar4 + m[0][1];
    m[0][1] = m[0][0];
    x._0_4_ = iVar2;
    m[0][0] = iVar3;
    if (((startx == (double)iVar4) && (!NAN(startx) && !NAN((double)iVar4))) ||
       (startx = 1.0 / (startx - (double)iVar4), 2147483647.0 < startx)) break;
  }
  ASDCP::Rational::Rational((Rational *)&in_local,x._0_4_,m[0][0]);
  return (Rational)in_local;
}

Assistant:

ASDCP::Rational AS_02::ConvertToRational(double in)
{

  //rational approximation to given real number
  //David Eppstein / UC Irvine / 8 Aug 1993
  i32_t m[2][2];
  double x, startx;
  i32_t maxden = std::numeric_limits<i32_t>::max();
  i32_t ai;

  startx = x = in;

  /* initialize matrix */
  m[0][0] = m[1][1] = 1;
  m[0][1] = m[1][0] = 0;

  /* loop finding terms until denom gets too big */
  while(m[1][0] * (ai = (long)x) + m[1][1] <= maxden)
  {
    i32_t t;
    t = m[0][0] * ai + m[0][1];
    m[0][1] = m[0][0];
    m[0][0] = t;
    t = m[1][0] * ai + m[1][1];
    m[1][1] = m[1][0];
    m[1][0] = t;
    if(x == (double)ai) break;     // AF: division by zero
    x = 1 / (x - (double)ai);
    if(x > (double)0x7FFFFFFF) break;  // AF: representation failure
  }

  /* now remaining x is between 0 and 1/ai */
  /* approx as either 0 or 1/m where m is max that will fit in maxden */
  /* first try zero */
  //printf("%ld/%ld, error = %e\n", m[0][0], m[1][0], startx - ((double)m[0][0] / (double)m[1][0]));

  return(ASDCP::Rational(m[0][0], m[1][0]));
  /* now try other possibility */
  //   ai = (maxden - m[1][1]) / m[1][0];
  //   m[0][0] = m[0][0] * ai + m[0][1];
  //   m[1][0] = m[1][0] * ai + m[1][1];
  //   printf("%ld/%ld, error = %e\n", m[0][0], m[1][0], startx - ((double)m[0][0] / (double)m[1][0]));
}